

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O0

bool __thiscall asl::WebSocket::closed(WebSocket *this)

{
  bool bVar1;
  int in_ESI;
  WebSocket *this_local;
  
  if ((this->_closed & 1U) == 0) {
    bVar1 = Socket::disconnected(&this->_socket);
    if (bVar1) {
      this->_closed = true;
      Socket::close(&this->_socket,in_ESI);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool WebSocket::closed()
{
	if (_closed)
		return true;
	if (_socket.disconnected()) {
		_closed = true;
		_socket.close();
		return true;
	}
	return false;
}